

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TVariable * __thiscall
glslang::HlslParseContext::declareNonArray
          (HlslParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,bool track)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  TVariable *variable;
  bool track_local;
  TType *type_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  this_local = (HlslParseContext *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)loc);
  TVariable::TVariable((TVariable *)this_local,identifier,type,false);
  bVar1 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_local);
  if (bVar1) {
    if ((track) &&
       (bVar1 = TSymbolTable::atGlobalLevel((this->super_TParseContextBase).symbolTable), bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,this_local);
    }
  }
  else {
    iVar2 = (*(this_local->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[3])();
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var,iVar2));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"redefinition",pcVar3,"");
    this_local = (HlslParseContext *)0x0;
  }
  return (TVariable *)this_local;
}

Assistant:

TVariable* HlslParseContext::declareNonArray(const TSourceLoc& loc, const TString& identifier, const TType& type,
                                             bool track)
{
    // make a new variable
    TVariable* variable = new TVariable(&identifier, type);

    // add variable to symbol table
    if (symbolTable.insert(*variable)) {
        if (track && symbolTable.atGlobalLevel())
            trackLinkage(*variable);
        return variable;
    }

    error(loc, "redefinition", variable->getName().c_str(), "");
    return nullptr;
}